

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O2

int readPPM(char *filename,uint32_t *width,uint32_t *height,uint8_t **RGB)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  FILE *__stream;
  size_t sVar3;
  uint8_t *__ptr;
  int iVar4;
  char *__s;
  ulong __size;
  char acStack_38 [3];
  char magic [3];
  uint32_t max;
  
  _acStack_38 = in_RAX;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    perror("Error opening rgb image for read");
    return 1;
  }
  sVar3 = fread((char *)((long)register0x00000020 + -0x37),1,2,__stream);
  _acStack_38 = (uint)(uint3)acStack_38;
  if ((sVar3 != 2) || (iVar1 = bcmp((char *)((long)register0x00000020 + -0x37),"P6",3), iVar1 != 0))
  {
    perror("Error reading rgb image header, or invalid format");
    fclose(__stream);
    return 3;
  }
  iVar2 = __isoc99_fscanf(__stream," %u %u %u ",width,height,&max);
  iVar1 = 3;
  __s = "Error reading rgb image header, or invalid values";
  iVar4 = iVar1;
  if ((iVar2 == 3) && (max < 0x100)) {
    __size = (ulong)(*width * *height * 3);
    __ptr = (uint8_t *)malloc(__size);
    *RGB = __ptr;
    if (__ptr == (uint8_t *)0x0) {
      iVar4 = 2;
      __s = "Error allocating rgb image memory";
    }
    else {
      sVar3 = fread(__ptr,1,__size,__stream);
      iVar4 = 0;
      if (sVar3 == __size) goto LAB_00102587;
      __s = "Error reading rgb image";
      iVar4 = iVar1;
    }
  }
  perror(__s);
LAB_00102587:
  fclose(__stream);
  return iVar4;
}

Assistant:

int readPPM(const char* filename, uint32_t *width, uint32_t *height, uint8_t **RGB)
{
	FILE *fp = fopen(filename, "rb");
	if(!fp)
	{
		perror("Error opening rgb image for read");
		return 1;
	}
	
	char magic[3];
	size_t result = fread(magic, 1, 2, fp);
	magic[2]='\0';
	if(result!=2 || strcmp(magic,"P6")!=0)
	{
		perror("Error reading rgb image header, or invalid format");
		fclose(fp);
		return 3;
	}
	
	uint32_t max;
	result = fscanf(fp, " %u %u %u ", width, height, &max);
	if(result!=3 || max>255)
	{
		perror("Error reading rgb image header, or invalid values");
		fclose(fp);
		return 3;
	}
	
	size_t size = 3*(*width)*(*height);
	*RGB = malloc(size);
	if(!*RGB)
	{
		perror("Error allocating rgb image memory");
		fclose(fp);
		return 2;
	}
	
	result = fread(*RGB, 1, size, fp);
	if(result != size)
	{
		perror("Error reading rgb image");
		fclose(fp);
		return 3;
	}
	
	fclose(fp);
	return 0;
}